

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

Am_Connection_Data * Am_Connection_Data::Narrow(Am_Wrapper *value)

{
  int iVar1;
  
  if ((value != (Am_Wrapper *)0x0) &&
     (iVar1 = (**(value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(),
     (Am_ID_Tag)iVar1 == id)) {
    return (Am_Connection_Data *)value;
  }
  return (Am_Connection_Data *)0x0;
}

Assistant:

Am_Connection_Data::Am_Connection_Data(void)
{
  m_socket = 1;             // Stdout on unix, shouldn't be used anyway
  connected = false;        // Connection flag: Am I Connected?
  waiting = false;          // Am I waiting to accept an incoming conn?
  Value_Queue.Make_Empty(); // Processed incoming data (None yet)
  List_Queue = nullptr;        // Lists being read in
  Object_Queue = nullptr;      // Objects being read in
}